

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixSync(sqlite3_file *id,int flags)

{
  unixFile *pFile_00;
  int iVar1;
  int *piVar2;
  int local_34;
  uint local_30;
  int dirfd;
  int isFullsync;
  int isDataOnly;
  unixFile *pFile;
  int rc;
  int flags_local;
  sqlite3_file *id_local;
  
  dirfd = flags & 0x10;
  local_30 = (uint)((flags & 0xfU) == 3);
  _isFullsync = (unixFile *)id;
  pFile._4_4_ = flags;
  _rc = id;
  pFile._0_4_ = full_fsync(*(int *)&id[3].pMethods,local_30,dirfd);
  pFile_00 = _isFullsync;
  if ((int)pFile == 0) {
    iVar1 = 0;
    if ((_isFullsync->ctrlFlags & 8) != 0) {
      pFile._0_4_ = (*aSyscall[0x11].pCurrent)(_isFullsync->zPath,&local_34);
      if ((int)pFile == 0) {
        full_fsync(local_34,0,0);
        robust_close(_isFullsync,local_34,0x994f);
      }
      else {
        pFile._0_4_ = 0;
      }
      _isFullsync->ctrlFlags = _isFullsync->ctrlFlags & 0xfff7;
      iVar1 = (int)pFile;
    }
    pFile._0_4_ = iVar1;
    id_local._4_4_ = (int)pFile;
  }
  else {
    piVar2 = __errno_location();
    storeLastErrno(pFile_00,*piVar2);
    id_local._4_4_ = unixLogErrorAtLine(0x40a,"full_fsync",_isFullsync->zPath,0x9941);
  }
  return id_local._4_4_;
}

Assistant:

static int unixSync(sqlite3_file *id, int flags){
  int rc;
  unixFile *pFile = (unixFile*)id;

  int isDataOnly = (flags&SQLITE_SYNC_DATAONLY);
  int isFullsync = (flags&0x0F)==SQLITE_SYNC_FULL;

  /* Check that one of SQLITE_SYNC_NORMAL or FULL was passed */
  assert((flags&0x0F)==SQLITE_SYNC_NORMAL
      || (flags&0x0F)==SQLITE_SYNC_FULL
  );

  /* Unix cannot, but some systems may return SQLITE_FULL from here. This
  ** line is to test that doing so does not cause any problems.
  */
  SimulateDiskfullError( return SQLITE_FULL );

  assert( pFile );
  OSTRACE(("SYNC    %-3d\n", pFile->h));
  rc = full_fsync(pFile->h, isFullsync, isDataOnly);
  SimulateIOError( rc=1 );
  if( rc ){
    storeLastErrno(pFile, errno);
    return unixLogError(SQLITE_IOERR_FSYNC, "full_fsync", pFile->zPath);
  }

  /* Also fsync the directory containing the file if the DIRSYNC flag
  ** is set.  This is a one-time occurrence.  Many systems (examples: AIX)
  ** are unable to fsync a directory, so ignore errors on the fsync.
  */
  if( pFile->ctrlFlags & UNIXFILE_DIRSYNC ){
    int dirfd;
    OSTRACE(("DIRSYNC %s (have_fullfsync=%d fullsync=%d)\n", pFile->zPath,
            HAVE_FULLFSYNC, isFullsync));
    rc = osOpenDirectory(pFile->zPath, &dirfd);
    if( rc==SQLITE_OK ){
      full_fsync(dirfd, 0, 0);
      robust_close(pFile, dirfd, __LINE__);
    }else{
      assert( rc==SQLITE_CANTOPEN );
      rc = SQLITE_OK;
    }
    pFile->ctrlFlags &= ~UNIXFILE_DIRSYNC;
  }
  return rc;
}